

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O3

void __thiscall helics::CommsInterface::disconnect(CommsInterface *this)

{
  char cVar1;
  char cVar2;
  rep in_RAX;
  uint uVar3;
  bool bVar4;
  string_view message;
  string_view message_00;
  milliseconds local_28;
  
  if (((this->operating)._M_base._M_i & 1U) == 0) {
    cVar2 = '\0';
    do {
      LOCK();
      cVar1 = (this->operating)._M_base._M_i;
      bVar4 = cVar2 == cVar1;
      if (bVar4) {
        (this->operating)._M_base._M_i = true;
        cVar1 = cVar2;
      }
      cVar2 = cVar1;
      UNLOCK();
      if (bVar4) {
        setRxStatus(this,TERMINATED);
        setTxStatus(this,TERMINATED);
        LOCK();
        if ((this->operating)._M_base._M_i == true) {
          (this->operating)._M_base._M_i = false;
        }
        UNLOCK();
        join_tx_rx_thread(this);
        return;
      }
    } while ((this->txStatus)._M_i == STARTUP);
  }
  (this->requestDisconnect)._M_base._M_i = true;
  local_28.__r = in_RAX;
  if ((this->rxStatus)._M_i < RECONNECTING) {
    (*this->_vptr_CommsInterface[7])(this);
  }
  if ((this->txStatus)._M_i < RECONNECTING) {
    (*this->_vptr_CommsInterface[6])(this);
  }
  if (((((this->tripDetector).lineDetector.
         super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_base).
       _M_i & 1U) != 0) {
    setRxStatus(this,TERMINATED);
    setTxStatus(this,TERMINATED);
    return;
  }
  uVar3 = 0;
  do {
    do {
      if (CONNECTED < (this->rxStatus)._M_i) {
LAB_00281607:
        uVar3 = 0;
        goto LAB_00281613;
      }
      local_28.__r = 800;
      bVar4 = gmlc::concurrency::TriggerVariable::wait_for(&this->rxTrigger,&local_28);
    } while (bVar4);
    uVar3 = uVar3 + 1;
    if ((uVar3 & 3) == 0) {
      (*this->_vptr_CommsInterface[7])(this);
    }
    if (uVar3 == 0xe) {
      message._M_str = "unable to terminate receiver connection";
      message._M_len = 0x27;
      logError(this,message);
      goto LAB_00281607;
    }
  } while (((((this->tripDetector).lineDetector.
              super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _M_base)._M_i & 1U) == 0);
  goto LAB_00281657;
  while (((((this->tripDetector).lineDetector.
            super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_base
          )._M_i & 1U) == 0) {
LAB_00281613:
    do {
      if (CONNECTED < (this->txStatus)._M_i) {
LAB_00281680:
        join_tx_rx_thread(this);
        return;
      }
      local_28.__r = 800;
      bVar4 = gmlc::concurrency::TriggerVariable::wait_for(&this->txTrigger,&local_28);
    } while (bVar4);
    uVar3 = uVar3 + 1;
    if ((uVar3 & 3) == 0) {
      (*this->_vptr_CommsInterface[6])(this);
    }
    if (uVar3 == 0xe) {
      message_00._M_str = "unable to terminate transmit connection";
      message_00._M_len = 0x27;
      logError(this,message_00);
      goto LAB_00281680;
    }
  }
LAB_00281657:
  LOCK();
  (this->rxStatus)._M_i = TERMINATED;
  UNLOCK();
  LOCK();
  (this->txStatus)._M_i = TERMINATED;
  UNLOCK();
  return;
}

Assistant:

void CommsInterface::disconnect()
{
    if (!operating) {
        if (propertyLock()) {
            setRxStatus(ConnectionStatus::TERMINATED);
            setTxStatus(ConnectionStatus::TERMINATED);
            propertyUnLock();
            join_tx_rx_thread();
            return;
        }
    }
    requestDisconnect.store(true, std::memory_order_release);

    if (rxStatus.load() <= ConnectionStatus::CONNECTED) {
        closeReceiver();
    }
    if (txStatus.load() <= ConnectionStatus::CONNECTED) {
        closeTransmitter();
    }
    if (tripDetector.isTripped()) {
        setRxStatus(ConnectionStatus::TERMINATED);
        setTxStatus(ConnectionStatus::TERMINATED);
        return;
    }
    int cnt = 0;
    while (rxStatus.load() <= ConnectionStatus::CONNECTED) {
        if (rxTrigger.wait_for(std::chrono::milliseconds(800))) {
            continue;
        }
        ++cnt;
        if ((cnt % 4) == 0)  // call this every 2400 milliseconds
        {
            // try calling closeReceiver again
            closeReceiver();
        }
        if (cnt == 14)  // Eventually give up
        {
            logError("unable to terminate receiver connection");
            break;
        }
        // check the trip detector
        if (tripDetector.isTripped()) {
            rxStatus = ConnectionStatus::TERMINATED;
            txStatus = ConnectionStatus::TERMINATED;
            return;
        }
    }
    cnt = 0;
    while (txStatus.load() <= ConnectionStatus::CONNECTED) {
        if (txTrigger.wait_for(std::chrono::milliseconds(800))) {
            continue;
        }
        ++cnt;
        if ((cnt % 4) == 0)  // call this every 2400 milliseconds
        {
            // try calling closeTransmitter again
            closeTransmitter();
        }
        if (cnt == 14)  // Eventually give up
        {
            logError("unable to terminate transmit connection");
            break;
        }
        // check the trip detector
        if (tripDetector.isTripped()) {
            rxStatus = ConnectionStatus::TERMINATED;
            txStatus = ConnectionStatus::TERMINATED;
            return;
        }
    }
    join_tx_rx_thread();
}